

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

void __thiscall Indexing::ClauseCodeTree::ClauseMatcher::reset(ClauseMatcher *this)

{
  ulong uVar1;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar2
  ;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  *this_00;
  long lVar3;
  
  uVar1 = (ulong)(uint)(this->lInfos)._size;
  if (uVar1 != 0) {
    lVar3 = 0;
    do {
      CodeTree::LitInfo::dispose((LitInfo *)((long)&((this->lInfos)._array)->liIndex + lVar3));
      lVar3 = lVar3 + 0x18;
    } while (uVar1 * 0x18 != lVar3);
  }
  this_00 = (this->lms)._cursor;
  pRVar2 = (this->lms)._stack;
  while (this_00 != pRVar2) {
    this_00 = this_00 + -1;
    ::Lib::
    Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(this_00);
    pRVar2 = (this->lms)._stack;
  }
  (this->lms)._cursor = pRVar2;
  return;
}

Assistant:

void ClauseCodeTree::ClauseMatcher::reset()
{
  unsigned liCnt=lInfos.size();
  for(unsigned i=0;i<liCnt;i++) {
    lInfos[i].dispose();
  }
  lms.reset();

#if VDEBUG
  ASS_EQ(tree->_clauseMatcherCounter,1);
  tree->_clauseMatcherCounter--;
#endif
}